

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

size_t __thiscall RPCHelpMan::GetParamIndex(RPCHelpMan *this,string_view key)

{
  long lVar1;
  bool bVar2;
  const_iterator cVar3;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> file;
  size_t sVar4;
  _Alloc_hider in_RSI;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> in_RDI;
  long in_FS_OFFSET;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> it;
  vector<RPCArg,_std::allocator<RPCArg>_> *this_00;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> __first;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
  in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (vector<RPCArg,_std::allocator<RPCArg>_> *)
            ((long)&((in_RDI._M_current)->m_fallback).
                    super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                    .
                    super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                    .
                    super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                    .
                    super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                    .
                    super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                    .
                    super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
            + 0x20);
  cVar3 = std::vector<RPCArg,_std::allocator<RPCArg>_>::begin(this_00);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::end(this_00);
  __first._M_current = (RPCArg *)&stack0xffffffffffffffe8;
  file = std::
         find_if<__gnu_cxx::__normal_iterator<RPCArg_const*,std::vector<RPCArg,std::allocator<RPCArg>>>,RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                   (in_stack_ffffffffffffffc8,in_RDI,cVar3._M_current);
  cVar3 = std::vector<RPCArg,_std::allocator<RPCArg>_>::end(this_00);
  bVar2 = __gnu_cxx::operator==<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                    (in_stack_ffffffffffffff98,
                     (__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                      *)this_00);
  inline_check_non_fatal<bool>
            ((bool *)in_RSI._M_p,(char *)file._M_current,
             CONCAT13(!bVar2,(int3)in_stack_ffffffffffffffdc),(char *)cVar3._M_current,
             (char *)in_stack_ffffffffffffffc8._M_current);
  cVar3 = std::vector<RPCArg,_std::allocator<RPCArg>_>::begin(this_00);
  sVar4 = std::
          distance<__gnu_cxx::__normal_iterator<RPCArg_const*,std::vector<RPCArg,std::allocator<RPCArg>>>>
                    (__first,(__normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_>
                              )cVar3._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar4;
  }
  __stack_chk_fail();
}

Assistant:

size_t RPCHelpMan::GetParamIndex(std::string_view key) const
{
    auto it{std::find_if(
        m_args.begin(), m_args.end(), [&key](const auto& arg) { return arg.GetName() == key;}
    )};

    CHECK_NONFATAL(it != m_args.end());  // TODO: ideally this is checked at compile time
    return std::distance(m_args.begin(), it);
}